

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> **ppRVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  uint uVar4;
  undefined4 uVar5;
  HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks> *indexObj;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table_00;
  
  pEVar2 = (this->rows).builder.ptr;
  table.size_ = (long)(this->rows).builder.pos - (long)pEVar2 >> 4;
  table.ptr = pEVar2;
  HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
  erase<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
            ((HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *)&this->indexes,
             table,pos,&pEVar2[pos].key);
  pEVar2 = (this->rows).builder.ptr;
  table_00.size_ = (long)(this->rows).builder.pos - (long)pEVar2 >> 4;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    table_00.ptr = pEVar2;
    HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
    move<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
              ((HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *)&this->indexes,
               table_00,oldPos,pos,&pEVar2[oldPos].key);
    pEVar3 = (this->rows).builder.ptr;
    pEVar2 = pEVar3 + oldPos;
    uVar4 = pEVar2->value;
    uVar5 = *(undefined4 *)&pEVar2->field_0xc;
    pEVar3 = pEVar3 + pos;
    pEVar3->key = pEVar2->key;
    pEVar3->value = uVar4;
    *(undefined4 *)&pEVar3->field_0xc = uVar5;
  }
  ppRVar1 = &(this->rows).builder.pos;
  *ppRVar1 = *ppRVar1 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}